

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1acb919::ReaderSpy::~ReaderSpy(ReaderSpy *this,void **vtt)

{
  void **vtt_local;
  ReaderSpy *this_local;
  
  this->super_Reader = (Reader)*vtt;
  *(void **)(&(this->super_Reader).field_0x0 + *(long *)((long)this->super_Reader + -0x30)) = vtt[3]
  ;
  std::__cxx11::string::~string((string *)&this->prefix);
  std::shared_ptr<dap::Writer>::~shared_ptr(&this->s);
  std::shared_ptr<dap::Reader>::~shared_ptr(&this->r);
  dap::Reader::~Reader(&this->super_Reader,vtt + 1);
  return;
}

Assistant:

ReaderSpy(const std::shared_ptr<dap::Reader>& r,
            const std::shared_ptr<dap::Writer>& s,
            const std::string& prefix)
      : r(r), s(s), prefix(prefix) {}